

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O2

void av1_fadst8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int32_t step [8];
  
  av1_range_check_buf(0,input,input,8,*stage_range);
  *output = *input;
  output[1] = -input[7];
  output[2] = -input[3];
  output[3] = input[4];
  output[4] = -input[1];
  output[5] = input[6];
  output[6] = input[2];
  output[7] = -input[5];
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  lVar8 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  step[0] = (int32_t)*(undefined8 *)output;
  step[1] = (int32_t)((ulong)*(undefined8 *)output >> 0x20);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1e0);
  lVar9 = 1L << (cos_bit - 1U & 0x3f);
  lVar10 = (long)output[2] * (long)iVar1 + lVar9;
  step[2] = (int32_t)(output[3] * iVar1 + lVar10 >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(output[3] * -iVar1 + lVar10 >> (cos_bit & 0x3fU));
  step[4] = (int32_t)*(undefined8 *)(output + 4);
  step[5] = (int32_t)((ulong)*(undefined8 *)(output + 4) >> 0x20);
  lVar10 = (long)output[6] * (long)iVar1 + lVar9;
  step[6] = (int32_t)(output[7] * iVar1 + lVar10 >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(-iVar1 * output[7] + lVar10 >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,8,stage_range[2]);
  auVar6._4_4_ = step[1];
  auVar6._0_4_ = step[0];
  auVar6._8_4_ = step[2];
  auVar6._12_4_ = step[3];
  auVar11._0_8_ = auVar6._8_8_;
  auVar11._8_4_ = step[0];
  auVar11._12_4_ = step[1];
  auVar4._4_8_ = auVar11._8_8_;
  auVar4._0_4_ = step[3] - step[1];
  auVar12._0_8_ = auVar4._0_8_ << 0x20;
  auVar12._8_4_ = step[0] - step[2];
  auVar12._12_4_ = step[1] - step[3];
  *(ulong *)output = CONCAT44(step[3] + step[1],step[2] + step[0]);
  *(long *)(output + 2) = auVar12._8_8_;
  auVar7._4_4_ = step[5];
  auVar7._0_4_ = step[4];
  auVar7._8_4_ = step[6];
  auVar7._12_4_ = step[7];
  auVar13._0_8_ = auVar7._8_8_;
  auVar13._8_4_ = step[4];
  auVar13._12_4_ = step[5];
  auVar5._4_8_ = auVar13._8_8_;
  auVar5._0_4_ = step[7] - step[5];
  auVar14._0_8_ = auVar5._0_8_ << 0x20;
  auVar14._8_4_ = step[4] - step[6];
  auVar14._12_4_ = step[5] - step[7];
  *(ulong *)(output + 4) = CONCAT44(step[7] + step[5],step[6] + step[4]);
  *(long *)(output + 6) = auVar14._8_8_;
  av1_range_check_buf(3,input,output,8,stage_range[3]);
  step[0] = (int32_t)*(undefined8 *)output;
  step[1] = (int32_t)((ulong)*(undefined8 *)output >> 0x20);
  step[2] = (int32_t)*(undefined8 *)(output + 2);
  step[3] = (int32_t)((ulong)*(undefined8 *)(output + 2) >> 0x20);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1a0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x220);
  step[4] = (int32_t)(output[4] * iVar1 + lVar9 + (long)(output[5] * iVar2) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar2 * output[4] + lVar9 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(output[7] * iVar1 + lVar9 + (long)-(iVar2 * output[6]) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(output[6] * iVar1 + lVar9 + (long)(output[7] * iVar2) >> (cos_bit & 0x3fU));
  av1_range_check_buf(4,input,step,8,stage_range[4]);
  output[4] = step[0] - step[4];
  output[5] = step[1] - step[5];
  output[6] = step[2] - step[6];
  output[7] = step[3] - step[7];
  *output = step[4] + step[0];
  output[1] = step[5] + step[1];
  output[2] = step[6] + step[2];
  output[3] = step[7] + step[3];
  av1_range_check_buf(5,input,output,8,stage_range[5]);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x250);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x170);
  step[0] = (int32_t)(*output * iVar2 + lVar9 + (long)(output[1] * iVar1) >> (cos_bit & 0x3fU));
  step[1] = (int32_t)(iVar1 * *output + lVar9 + (long)-(iVar2 * output[1]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1b0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x210);
  step[2] = (int32_t)(output[2] * iVar1 + lVar9 + (long)(output[3] * iVar2) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar2 * output[2] + lVar9 + (long)-(iVar1 * output[3]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1f0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1d0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar8 + 400);
  step[4] = (int32_t)(output[4] * iVar1 + lVar9 + (long)(output[5] * iVar2) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar2 * output[4] + lVar9 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x230);
  step[6] = (int32_t)(output[6] * iVar1 + lVar9 + (long)(output[7] * iVar3) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(iVar3 * output[6] + lVar9 + (long)-(iVar1 * output[7]) >> (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,step,8,stage_range[6]);
  *output = step[1];
  output[1] = step[6];
  output[2] = step[3];
  output[3] = step[4];
  output[4] = step[5];
  output[5] = step[2];
  output[6] = step[7];
  output[7] = step[0];
  av1_range_check_buf(7,input,output,8,stage_range[7]);
  return;
}

Assistant:

void av1_fadst8(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  const int32_t size = 8;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  assert(output != input);
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = -input[7];
  bf1[2] = -input[3];
  bf1[3] = input[4];
  bf1[4] = -input[1];
  bf1[5] = input[6];
  bf1[6] = input[2];
  bf1[7] = -input[5];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[2];
  bf1[1] = bf0[1] + bf0[3];
  bf1[2] = bf0[0] - bf0[2];
  bf1[3] = bf0[1] - bf0[3];
  bf1[4] = bf0[4] + bf0[6];
  bf1[5] = bf0[5] + bf0[7];
  bf1[6] = bf0[4] - bf0[6];
  bf1[7] = bf0[5] - bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[4];
  bf1[1] = bf0[1] + bf0[5];
  bf1[2] = bf0[2] + bf0[6];
  bf1[3] = bf0[3] + bf0[7];
  bf1[4] = bf0[0] - bf0[4];
  bf1[5] = bf0[1] - bf0[5];
  bf1[6] = bf0[2] - bf0[6];
  bf1[7] = bf0[3] - bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[4], bf0[0], cospi[60], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[60], bf0[0], -cospi[4], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[20], bf0[2], cospi[44], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[44], bf0[2], -cospi[20], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[36], bf0[4], cospi[28], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[28], bf0[4], -cospi[36], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[52], bf0[6], cospi[12], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[12], bf0[6], -cospi[52], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[1];
  bf1[1] = bf0[6];
  bf1[2] = bf0[3];
  bf1[3] = bf0[4];
  bf1[4] = bf0[5];
  bf1[5] = bf0[2];
  bf1[6] = bf0[7];
  bf1[7] = bf0[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}